

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_44c526::TransformSelectorAt::Validate(TransformSelectorAt *this,size_t count)

{
  index_type *piVar1;
  index_type *piVar2;
  vector<long,_std::allocator<long>_> indexes;
  index_type local_50;
  _Vector_base<long,_std::allocator<long>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar1 = (this->super_TransformSelectorIndexes).Indexes.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  for (piVar2 = (this->super_TransformSelectorIndexes).Indexes.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    local_50 = TransformSelectorIndexes::NormalizeIndex
                         (&this->super_TransformSelectorIndexes,*piVar2,count);
    std::vector<long,_std::allocator<long>_>::emplace_back<long>
              ((vector<long,_std::allocator<long>_> *)&local_48,&local_50);
  }
  std::vector<long,_std::allocator<long>_>::_M_move_assign
            (&(this->super_TransformSelectorIndexes).Indexes,&local_48);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
  return true;
}

Assistant:

bool Validate(std::size_t count) override
  {
    decltype(this->Indexes) indexes;

    for (auto index : this->Indexes) {
      indexes.push_back(this->NormalizeIndex(index, count));
    }
    this->Indexes = std::move(indexes);

    return true;
  }